

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

QPlatformMenuItem * __thiscall
QMenuPrivate::insertActionInPlatformMenu
          (QMenuPrivate *this,QAction *action,QPlatformMenuItem *beforeItem)

{
  QObject *pQVar1;
  QPlatformMenuItem *item;
  long in_FS_OFFSET;
  Object local_58 [8];
  code *local_50;
  undefined8 local_48;
  Object local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  item = (QPlatformMenuItem *)(**(code **)(*(long *)(this->platformMenu).wp.value + 0xf0))();
  (**(code **)(*(long *)item + 0x60))(item,action);
  local_50 = QAction::trigger;
  local_48 = 0;
  QObject::connect<void(QPlatformMenuItem::*)(),void(QAction::*)()>
            (local_40,(offset_in_QPlatformMenuItem_to_subr)item,
             (ContextType *)QPlatformMenuItem::activated,(offset_in_QAction_to_subr *)0x0,
             (ConnectionType)action);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_50 = QAction::hovered;
  local_48 = 0;
  QObject::connect<void(QPlatformMenuItem::*)(),void(QAction::*)()>
            (local_58,(offset_in_QPlatformMenuItem_to_subr)item,
             (ContextType *)QPlatformMenuItem::hovered,(offset_in_QAction_to_subr *)0x0,
             (ConnectionType)action);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  copyActionToPlatformItem(this,action,item);
  pQVar1 = (this->platformMenu).wp.value;
  (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1,item,beforeItem);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return item;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformMenuItem * QMenuPrivate::insertActionInPlatformMenu(const QAction *action, QPlatformMenuItem *beforeItem)
{
    QPlatformMenuItem *menuItem = platformMenu->createMenuItem();
    Q_ASSERT(menuItem);

    menuItem->setTag(reinterpret_cast<quintptr>(action));
    QObject::connect(menuItem, &QPlatformMenuItem::activated, action, &QAction::trigger, Qt::QueuedConnection);
    QObject::connect(menuItem, &QPlatformMenuItem::hovered, action, &QAction::hovered, Qt::QueuedConnection);
    copyActionToPlatformItem(action, menuItem);
    platformMenu->insertMenuItem(menuItem, beforeItem);

    return menuItem;
}